

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint32_t *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int log [256];
  int pow [256];
  int aiStack_838 [256];
  uint auStack_438 [258];
  
  if (aes_init_done == '\0') {
    uVar5 = 1;
    lVar3 = 0;
    do {
      auStack_438[lVar3] = uVar5;
      aiStack_838[uVar5] = (int)lVar3;
      uVar8 = 0x1b;
      if (uVar5 < 0x80) {
        uVar8 = 0;
      }
      uVar5 = uVar5 * 2 & 0xff ^ uVar5 ^ uVar8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    uVar5 = 1;
    lVar3 = 0;
    do {
      *(uint *)((long)RCON + lVar3) = uVar5;
      uVar8 = 0x1b;
      if (uVar5 < 0x80) {
        uVar8 = 0;
      }
      uVar5 = uVar5 * 2 & 0xff ^ uVar8;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x28);
    FSb[0] = 'c';
    RSb[99] = '\0';
    lVar3 = 1;
    do {
      uVar5 = auStack_438[0xff - (long)aiStack_838[lVar3]];
      uVar8 = uVar5 >> 7 | uVar5 * 2;
      uVar6 = uVar8 & 0xff;
      uVar9 = uVar8 * 2 & 0xff;
      uVar11 = uVar6 >> 7 | uVar9;
      uVar8 = uVar11 * 2;
      uVar9 = uVar9 >> 7;
      uVar12 = uVar8 & 0xff;
      uVar7 = (long)(int)(uVar6 ^ uVar5 ^ uVar11 ^ (uVar9 | uVar12) ^
                         (uVar12 >> 7) + (uVar9 | uVar8 & 0x7f) * 2) ^ 99;
      FSb[lVar3] = (uchar)uVar7;
      RSb[uVar7] = (uchar)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    lVar3 = -0x400;
    lVar13 = 0;
    do {
      bVar1 = FSb[lVar13];
      uVar5 = 0x1b;
      if (-1 < (char)bVar1) {
        uVar5 = 0;
      }
      uVar5 = (uint)bVar1 * 2 & 0xff ^ uVar5;
      uVar8 = uVar5 ^ bVar1;
      uVar6 = uVar8 << 0x18 | (uint)bVar1 << 0x10 | (uint)bVar1 << 8;
      uVar9 = uVar6 | uVar5;
      *(uint *)((long)FT1 + lVar3) = uVar9;
      *(uint *)((long)FT2 + lVar3) = uVar9 << 8 | uVar8;
      *(uint *)((long)FT3 + lVar3) = uVar9 << 0x10 | uVar6 >> 0x10;
      *(uint *)(RSb + lVar3) = uVar5 << 0x18 | uVar6 >> 8;
      uVar5 = 0;
      if ((ulong)RSb[lVar13] != 0) {
        iVar2 = aiStack_838[RSb[lVar13]];
        uVar5 = auStack_438[(iVar2 + aiStack_838[0xb]) % 0xff] << 0x18 ^
                auStack_438[(aiStack_838[0xd] + iVar2) % 0xff] << 0x10 ^
                auStack_438[(aiStack_838[9] + iVar2) % 0xff] << 8 ^
                auStack_438[(aiStack_838[0xe] + iVar2) % 0xff];
      }
      *(uint *)((long)RT1 + lVar3) = uVar5;
      *(uint *)((long)RT2 + lVar3) = uVar5 << 8 | uVar5 >> 0x18;
      *(uint *)((long)RT3 + lVar3) = uVar5 << 0x10 | uVar5 >> 0x10;
      *(uint *)((long)FT0 + lVar3) = uVar5 << 0x18 | uVar5 >> 8;
      lVar13 = lVar13 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0);
    aes_init_done = '\x01';
  }
  if (keybits == 0x80) {
    iVar2 = 10;
  }
  else if (keybits == 0x100) {
    iVar2 = 0xe;
  }
  else {
    if (keybits != 0xc0) {
      return -0x20;
    }
    iVar2 = 0xc;
  }
  ctx->nr = iVar2;
  ctx->rk = ctx->buf;
  iVar2 = mbedtls_aesni_has_support(0x2000000);
  if (iVar2 == 0) {
    uVar7 = 0;
    do {
      ctx->buf[uVar7] = *(uint32_t *)(key + uVar7 * 4);
      uVar7 = uVar7 + 1;
    } while (keybits >> 5 != uVar7);
    iVar2 = ctx->nr;
    if (iVar2 == 10) {
      uVar10 = ctx->buf[0];
      lVar3 = 0;
      do {
        uVar5 = ctx->buf[lVar3 + 3];
        uVar10 = (uint)FSb[uVar5 & 0xff] << 0x18 ^ (uint)FSb[uVar5 >> 0x18] << 0x10 ^
                 (uint)FSb[uVar5 >> 0x10 & 0xff] << 8 ^
                 (uint)FSb[uVar5 >> 8 & 0xff] ^ uVar10 ^ *(uint *)((long)RCON + lVar3);
        ctx->buf[lVar3 + 4] = uVar10;
        uVar8 = ctx->buf[lVar3 + 1] ^ uVar10;
        ctx->buf[lVar3 + 5] = uVar8;
        uVar8 = uVar8 ^ ctx->buf[lVar3 + 2];
        ctx->buf[lVar3 + 6] = uVar8;
        ctx->buf[lVar3 + 7] = uVar8 ^ uVar5;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x28);
    }
    else if (iVar2 == 0xc) {
      uVar10 = ctx->buf[0];
      puVar4 = ctx->buf + 0xb;
      lVar3 = 0;
      do {
        uVar5 = puVar4[-6];
        uVar10 = (uint)FSb[uVar5 & 0xff] << 0x18 ^ (uint)FSb[uVar5 >> 0x18] << 0x10 ^
                 (uint)FSb[uVar5 >> 0x10 & 0xff] << 8 ^
                 (uint)FSb[uVar5 >> 8 & 0xff] ^ uVar10 ^ *(uint *)((long)RCON + lVar3);
        puVar4[-5] = uVar10;
        puVar4[-4] = puVar4[-10] ^ uVar10;
        uVar8 = puVar4[-10] ^ uVar10 ^ puVar4[-9];
        puVar4[-3] = uVar8;
        uVar8 = uVar8 ^ puVar4[-8];
        puVar4[-2] = uVar8;
        uVar8 = uVar8 ^ puVar4[-7];
        puVar4[-1] = uVar8;
        *puVar4 = uVar8 ^ uVar5;
        lVar3 = lVar3 + 4;
        puVar4 = puVar4 + 6;
      } while (lVar3 != 0x20);
    }
    else if (iVar2 == 0xe) {
      uVar10 = ctx->buf[0];
      lVar3 = 0;
      do {
        uVar5 = ctx->buf[lVar3 * 2 + 7];
        uVar10 = (uint)FSb[uVar5 & 0xff] << 0x18 ^ (uint)FSb[uVar5 >> 0x18] << 0x10 ^
                 (uint)FSb[uVar5 >> 0x10 & 0xff] << 8 ^
                 (uint)FSb[uVar5 >> 8 & 0xff] ^ uVar10 ^ *(uint *)((long)RCON + lVar3);
        ctx->buf[lVar3 * 2 + 8] = uVar10;
        uVar8 = ctx->buf[lVar3 * 2 + 1] ^ uVar10;
        ctx->buf[lVar3 * 2 + 9] = uVar8;
        uVar8 = uVar8 ^ ctx->buf[lVar3 * 2 + 2];
        ctx->buf[lVar3 * 2 + 10] = uVar8;
        uVar8 = uVar8 ^ ctx->buf[lVar3 * 2 + 3];
        ctx->buf[lVar3 * 2 + 0xb] = uVar8;
        uVar8 = (uint)FSb[uVar8 >> 0x18] << 0x18 ^ (uint)FSb[uVar8 >> 0x10 & 0xff] << 0x10 ^
                (uint)FSb[uVar8 >> 8 & 0xff] << 8 ^
                (uint)FSb[uVar8 & 0xff] ^ ctx->buf[lVar3 * 2 + 4];
        ctx->buf[lVar3 * 2 + 0xc] = uVar8;
        uVar8 = uVar8 ^ ctx->buf[lVar3 * 2 + 5];
        ctx->buf[lVar3 * 2 + 0xd] = uVar8;
        uVar8 = uVar8 ^ ctx->buf[lVar3 * 2 + 6];
        ctx->buf[lVar3 * 2 + 0xe] = uVar8;
        ctx->buf[lVar3 * 2 + 0xf] = uVar8 ^ uVar5;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x1c);
    }
    return 0;
  }
  iVar2 = mbedtls_aesni_setkey_enc((uchar *)ctx->rk,key,(ulong)keybits);
  return iVar2;
}

Assistant:

int mbedtls_aes_setkey_enc( mbedtls_aes_context *ctx, const unsigned char *key,
                    unsigned int keybits )
{
    unsigned int i;
    uint32_t *RK;

#if !defined(MBEDTLS_AES_ROM_TABLES)
    if( aes_init_done == 0 )
    {
        aes_gen_tables();
        aes_init_done = 1;

    }
#endif

    switch( keybits )
    {
        case 128: ctx->nr = 10; break;
        case 192: ctx->nr = 12; break;
        case 256: ctx->nr = 14; break;
        default : return( MBEDTLS_ERR_AES_INVALID_KEY_LENGTH );
    }

#if defined(MBEDTLS_PADLOCK_C) && defined(MBEDTLS_PADLOCK_ALIGN16)
    if( aes_padlock_ace == -1 )
        aes_padlock_ace = mbedtls_padlock_has_support( MBEDTLS_PADLOCK_ACE );

    if( aes_padlock_ace )
        ctx->rk = RK = MBEDTLS_PADLOCK_ALIGN16( ctx->buf );
    else
#endif
    ctx->rk = RK = ctx->buf;

#if defined(MBEDTLS_AESNI_C) && defined(MBEDTLS_HAVE_X86_64)
    if( mbedtls_aesni_has_support( MBEDTLS_AESNI_AES ) )
        return( mbedtls_aesni_setkey_enc( (unsigned char *) ctx->rk, key, keybits ) );
#endif

    for( i = 0; i < ( keybits >> 5 ); i++ )
    {
        GET_UINT32_LE( RK[i], key, i << 2 );
    }

    switch( ctx->nr )
    {
        case 10:

            for( i = 0; i < 10; i++, RK += 4 )
            {
                RK[4]  = RK[0] ^ RCON[i] ^
                ( (uint32_t) FSb[ ( RK[3] >>  8 ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[3] >> 16 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[3] >> 24 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[3]       ) & 0xFF ] << 24 );

                RK[5]  = RK[1] ^ RK[4];
                RK[6]  = RK[2] ^ RK[5];
                RK[7]  = RK[3] ^ RK[6];
            }
            break;

        case 12:

            for( i = 0; i < 8; i++, RK += 6 )
            {
                RK[6]  = RK[0] ^ RCON[i] ^
                ( (uint32_t) FSb[ ( RK[5] >>  8 ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[5] >> 16 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[5] >> 24 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[5]       ) & 0xFF ] << 24 );

                RK[7]  = RK[1] ^ RK[6];
                RK[8]  = RK[2] ^ RK[7];
                RK[9]  = RK[3] ^ RK[8];
                RK[10] = RK[4] ^ RK[9];
                RK[11] = RK[5] ^ RK[10];
            }
            break;

        case 14:

            for( i = 0; i < 7; i++, RK += 8 )
            {
                RK[8]  = RK[0] ^ RCON[i] ^
                ( (uint32_t) FSb[ ( RK[7] >>  8 ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[7] >> 16 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[7] >> 24 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[7]       ) & 0xFF ] << 24 );

                RK[9]  = RK[1] ^ RK[8];
                RK[10] = RK[2] ^ RK[9];
                RK[11] = RK[3] ^ RK[10];

                RK[12] = RK[4] ^
                ( (uint32_t) FSb[ ( RK[11]       ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[11] >>  8 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[11] >> 16 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[11] >> 24 ) & 0xFF ] << 24 );

                RK[13] = RK[5] ^ RK[12];
                RK[14] = RK[6] ^ RK[13];
                RK[15] = RK[7] ^ RK[14];
            }
            break;
    }

    return( 0 );
}